

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry_&> __thiscall
kj::
Table<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
::find<0ul,unsigned_long&>
          (Table<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
           *this,unsigned_long *params)

{
  long lVar1;
  ArrayPtr<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry> table;
  HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks> local_28 [8];
  long local_20;
  
  table.ptr = (Entry *)(params + 4);
  table.size_ = *params;
  HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>::
  find<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry,unsigned_long&>
            (local_28,table,(unsigned_long *)((long)(params[1] - *params) >> 4));
  if (local_28[0] == (HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>)0x1) {
    lVar1 = local_20 * 0x10 + *params;
  }
  else {
    lVar1 = 0;
  }
  *(long *)this = lVar1;
  return (Maybe<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry_&>)(Entry *)this;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}